

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.h
# Opt level: O3

void __thiscall
HighsGFkSolve::fromCSC<2u,1,long>
          (HighsGFkSolve *this,vector<long,_std::allocator<long>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart,
          HighsInt numRow)

{
  pointer puVar1;
  iterator __position;
  iterator iVar2;
  int iVar3;
  pointer piVar4;
  value_type_conflict3 vVar5;
  int *__args;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_type sVar9;
  uint uVar10;
  long lVar11;
  value_type_conflict3 local_58;
  uint local_54;
  vector<int,std::allocator<int>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  puVar1 = (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  piVar4 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  local_40 = &this->Avalue;
  local_48 = (vector<int,std::allocator<int>> *)&this->Acol;
  local_50 = (vector<int,std::allocator<int>> *)&this->Arow;
  piVar4 = (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = Aindex;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4);
  }
  iVar3 = (int)((ulong)((long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  this->numCol = iVar3;
  this->numRow = numRow;
  local_58 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colhead,(long)iVar3,(value_type_conflict2 *)&local_58);
  uVar8 = 0;
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colsize,(long)this->numCol,(value_type_conflict2 *)&local_58);
  sVar9 = (size_type)numRow;
  local_58 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->rhs,sVar9,&local_58);
  local_58 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowroot,sVar9,(value_type_conflict2 *)&local_58);
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowsize,sVar9,(value_type_conflict2 *)&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_40,(long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_48,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_50,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_58 = 0;
  vVar5 = this->numCol;
  if (vVar5 != 0) {
    piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      iVar6 = (int)uVar8;
      iVar3 = piVar4[iVar6];
      if (iVar3 == piVar4[(long)iVar6 + 1]) {
        uVar8 = (ulong)(iVar6 + 1);
      }
      else {
        lVar11 = (long)iVar3 << 2;
        do {
          if ((*(byte *)((long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar11 * 2) & 1) != 0) {
            local_54 = 1;
            __position._M_current =
                 (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_40,__position,&local_54);
            }
            else {
              *__position._M_current = 1;
              (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar2._M_current =
                 (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_48,iVar2,(int *)&local_58);
            }
            else {
              *iVar2._M_current = local_58;
              (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            __args = (int *)((long)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + lVar11);
            iVar2._M_current =
                 (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_50,iVar2,__args);
            }
            else {
              *iVar2._M_current = *__args;
              (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 4;
          iVar3 = iVar3 + 1;
        } while (iVar3 != piVar4[(long)(int)local_58 + 1]);
        uVar8 = (long)(int)local_58 + 1;
        vVar5 = this->numCol;
      }
      local_58 = (value_type_conflict3)uVar8;
    } while (local_58 != vVar5);
  }
  uVar10 = (uint)((ulong)((long)(this->Avalue).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->Avalue).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  sVar9 = (size_type)(int)uVar10;
  std::vector<int,_std::allocator<int>_>::resize(&this->Anext,sVar9);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aprev,sVar9);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARleft,sVar9);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARright,sVar9);
  if (uVar10 != 0) {
    uVar7 = 0;
    __to = extraout_RDX;
    do {
      link(this,(char *)(ulong)uVar7,__to);
      uVar7 = uVar7 + 1;
      __to = extraout_RDX_00;
    } while (uVar10 != uVar7);
  }
  return;
}

Assistant:

void fromCSC(const std::vector<T>& Aval, const std::vector<HighsInt>& Aindex,
               const std::vector<HighsInt>& Astart, HighsInt numRow) {
    Avalue.clear();
    Acol.clear();
    Arow.clear();

    freeslots = decltype(freeslots)();

    numCol = Astart.size() - 1;
    this->numRow = numRow;

    colhead.assign(numCol, -1);
    colsize.assign(numCol, 0);

    rhs.assign(kNumRhs * numRow, 0);
    rowroot.assign(numRow, -1);
    rowsize.assign(numRow, 0);

    Avalue.reserve(Aval.size());
    Acol.reserve(Aval.size());
    Arow.reserve(Aval.size());

    for (HighsInt i = 0; i != numCol; ++i) {
      for (HighsInt j = Astart[i]; j != Astart[i + 1]; ++j) {
        assert(Aval[j] == (int64_t)Aval[j]);
        int64_t val = ((int64_t)Aval[j]) % k;
        if (val == 0) continue;

        if (val < 0) val += k;
        assert(val >= 0);

        Avalue.push_back(val);
        Acol.push_back(i);
        Arow.push_back(Aindex[j]);
      }
    }

    HighsInt nnz = Avalue.size();
    Anext.resize(nnz);
    Aprev.resize(nnz);
    ARleft.resize(nnz);
    ARright.resize(nnz);
    for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);
  }